

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::delete_leaf_node(btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                   *this,node_type *node)

{
  byte bVar1;
  byte bVar2;
  node_type *node_00;
  
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  ::destroy((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
             *)this,(allocator_type *)node);
  if (((ulong)this & 7) == 0) {
    bVar1 = *(byte *)((long)&this->rightmost_ + 3);
    bVar2 = 7;
    if (bVar1 != 0) {
      bVar2 = bVar1;
    }
    deallocate((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                *)((ulong)bVar2 << 5 | 0x10),(size_type)this,node_00);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void delete_leaf_node(node_type *node) {
            node->destroy(mutable_allocator());
            deallocate(node_type::LeafSize(node->max_count()), node);
        }